

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreePrevious(BtCursor *pCur,int flags)

{
  char cVar1;
  uint uVar2;
  MemPage *pMVar3;
  ushort uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)flags;
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (((pCur->eState == '\x01') && (pCur->ix != 0)) && (pCur->apPage[pCur->iPage]->leaf != '\0')) {
    pCur->ix = pCur->ix - 1;
    return 0;
  }
  if (pCur->eState != 1) {
    iVar5 = 0;
    if (2 < pCur->eState) {
      iVar5 = btreeRestoreCursorPosition(pCur);
    }
    if (iVar5 != 0) {
      return iVar5;
    }
    if (pCur->eState == '\0') {
      return 0x65;
    }
    iVar5 = pCur->skipNext;
    if (iVar5 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (iVar5 < 0) {
        return 0;
      }
    }
  }
  pMVar3 = pCur->apPage[pCur->iPage];
  uVar4 = pCur->ix;
  if (pMVar3->leaf == '\0') {
    uVar2 = *(uint *)(pMVar3->aData +
                     (CONCAT11(pMVar3->aCellIdx[(ulong)uVar4 * 2],
                               pMVar3->aCellIdx[(ulong)uVar4 * 2 + 1]) & pMVar3->maskPage));
    iVar5 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
    if (iVar5 == 0) {
      iVar5 = moveToRightmost(pCur);
      return iVar5;
    }
  }
  else {
    while (uVar4 == 0) {
      cVar1 = pCur->iPage;
      lVar6 = (long)cVar1;
      if (lVar6 == 0) {
        pCur->eState = '\0';
        return 0x65;
      }
      (pCur->info).nSize = 0;
      pCur->curFlags = pCur->curFlags & 0xf9;
      pCur->ix = pCur->aiIdx[lVar6 + -1];
      pCur->iPage = cVar1 + -1;
      sqlite3PagerUnrefNotNull(pCur->apPage[lVar6]->pDbPage);
      uVar4 = pCur->ix;
    }
    pCur->ix = uVar4 - 1;
    iVar5 = 0;
    if ((pCur->apPage[pCur->iPage]->intKey != '\0') && (pCur->apPage[pCur->iPage]->leaf == '\0')) {
      iVar5 = sqlite3BtreePrevious(pCur,(int)uVar7);
      return iVar5;
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int flags){
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->ix==0
   || pCur->apPage[pCur->iPage]->leaf==0
  ){
    return btreePrevious(pCur);
  }
  pCur->ix--;
  return SQLITE_OK;
}